

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O1

string * __thiscall
BamTools::Internal::HttpHeader::ToString_abi_cxx11_(string *__return_storage_ptr__,HttpHeader *this)

{
  long *plVar1;
  _Base_ptr p_Var2;
  long *plVar3;
  _Rb_tree_header *p_Var4;
  long *local_98;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (this->m_isValid == true) {
    p_Var2 = (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(this->m_fields)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var4) {
      do {
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var2 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Constants::FIELD_SEPARATOR_abi_cxx11_);
        plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(p_Var2 + 2));
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_60 = *plVar3;
          lStack_58 = plVar1[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar3;
          local_70 = (long *)*plVar1;
        }
        local_68 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,Constants::FIELD_NEWLINE_abi_cxx11_);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_88 = *plVar3;
          lStack_80 = plVar1[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar3;
          local_98 = (long *)*plVar1;
        }
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
        if (local_98 != &local_88) {
          operator_delete(local_98);
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string HttpHeader::ToString(void) const {
    string result("");
    if ( m_isValid ) {
        map<string, string>::const_iterator fieldIter = m_fields.begin();
        map<string, string>::const_iterator fieldEnd  = m_fields.end();
        for ( ; fieldIter != fieldEnd; ++fieldIter ) {
            const string& key   = (*fieldIter).first;
            const string& value = (*fieldIter).second;
            const string& line  = key   + Constants::FIELD_SEPARATOR +
                                  value + Constants::FIELD_NEWLINE;
            result += line;
        }
    }
    return result;
}